

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

void __thiscall cg_box::cg_box(cg_box *this,s_i raw,int sep,int just,int fill,bool *empty)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  int local_b0;
  undefined1 auStack_80 [4];
  int c;
  s_i x_1;
  int local_60;
  int col;
  int row;
  int i;
  undefined1 local_50 [8];
  s_i x;
  int local_30;
  int rlen;
  int nrows;
  int maxrow;
  bool *empty_local;
  int local_18;
  int fill_local;
  int just_local;
  int sep_local;
  cg_box *this_local;
  
  rlen = 0;
  local_30 = 0;
  x.i._4_4_ = 0;
  local_50 = (undefined1  [8])raw.s;
  x.s = (str *)raw._8_8_;
  x._8_8_ = raw.i;
  _nrows = empty;
  empty_local._4_4_ = fill;
  local_18 = just;
  fill_local = sep;
  _just_local = this;
  while (bVar2 = s_i::atEnd((s_i *)local_50), ((bVar2 ^ 0xffU) & 1) != 0) {
    iVar3 = s_i::get((s_i *)local_50);
    if (iVar3 == fill_local) {
      piVar4 = std::max<int>(&rlen,(int *)((long)&x.i + 4));
      rlen = *piVar4;
      x.i._4_4_ = 0;
      local_30 = local_30 + 1;
    }
    else {
      x.i._4_4_ = x.i._4_4_ + 1;
    }
  }
  if (x.i._4_4_ != 0) {
    piVar4 = std::max<int>(&rlen,(int *)((long)&x.i + 4));
    rlen = *piVar4;
    local_30 = local_30 + 1;
  }
  *_nrows = rlen < 1;
  if ((*_nrows & 1U) != 0) {
    empty_local._4_4_ = -0x80000000;
  }
  i = 1;
  piVar4 = std::max<int>(&i,&rlen);
  this->w = *piVar4;
  row = 1;
  piVar4 = std::max<int>(&row,&local_30);
  this->h = *piVar4;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(this->w * this->h);
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar5);
  this->data = piVar4;
  for (col = 0; col < this->w * this->h; col = col + 1) {
    this->data[col] = empty_local._4_4_;
  }
  local_60 = 0;
  x_1.i._4_4_ = 0;
  _auStack_80 = raw.s;
  x_1.s = (str *)raw._8_8_;
  x_1._8_8_ = raw.i;
  while (bVar2 = s_i::atEnd((s_i *)auStack_80), ((bVar2 ^ 0xffU) & 1) != 0) {
    iVar3 = s_i::get((s_i *)auStack_80);
    if (iVar3 == fill_local) {
      x_1.i._4_4_ = 0;
      local_60 = local_60 + 1;
    }
    else {
      if (local_18 == 1) {
        local_b0 = (this->w + -1) - x_1.i._4_4_;
      }
      else {
        local_b0 = x_1.i._4_4_;
      }
      this->data[this->w * local_60 + local_b0] = iVar3;
      x_1.i._4_4_ = x_1.i._4_4_ + 1;
    }
  }
  return;
}

Assistant:

cg_box(s_i raw, int sep, int just, int fill, bool &empty) {
        int maxrow = 0, nrows = 0, rlen = 0;
        for (s_i x = raw; !x.atEnd(); ) {
            if (x.get() == sep) {
                maxrow = max(maxrow, rlen);
                rlen = 0;
                nrows++;
            } else {
                rlen++;
            }
        }
        if (rlen) {
            maxrow = max(maxrow, rlen);
            nrows++;
        }
        empty = maxrow < 1;
        if (empty) fill = OUT_CHAR;
        w = max(1, maxrow);
        h = max(1, nrows);
        data = new int[w*h];
        for (int i = 0; i < w*h; i++) data[i] = fill;

        int row = 0, col = 0;
        for (s_i x = raw; !x.atEnd();) {
            int c = x.get();
            if (c == sep) {
                col = 0;
                row++;
            } else {
                data[w*row + (just == 1 ? w - 1 - col : col)] = c;
                col++;
            }
        }
    }